

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EasyScreenCapturerLinux.cpp
# Opt level: O0

StatusCode __thiscall
media::EasyScreenCapturerLinux::CaptureScreenAsBmp
          (EasyScreenCapturerLinux *this,string *fileName,uint startX,uint startY,uint width,
          uint height)

{
  undefined1 local_70 [4];
  StatusCode res;
  CaptureBmpData bmp;
  uint height_local;
  uint width_local;
  uint startY_local;
  uint startX_local;
  string *fileName_local;
  EasyScreenCapturerLinux *this_local;
  
  bmp.m_dataLen._0_4_ = height;
  bmp.m_dataLen._4_4_ = width;
  CaptureBmpData::CaptureBmpData((CaptureBmpData *)local_70);
  this_local._4_4_ =
       (*(this->super_EasyScreenCapturer)._vptr_EasyScreenCapturer[4])
                 (this,(CaptureBmpData *)local_70,(ulong)startX,(ulong)startY,
                  (ulong)bmp.m_dataLen._4_4_,(ulong)(uint)bmp.m_dataLen);
  if (this_local._4_4_ == CAPTURE_OK) {
    this_local._4_4_ = SaveBmpBitsAsFile(this,fileName,(CaptureBmpData *)local_70);
  }
  CaptureBmpData::~CaptureBmpData((CaptureBmpData *)local_70);
  return this_local._4_4_;
}

Assistant:

StatusCode EasyScreenCapturerLinux::CaptureScreenAsBmp(
    const std::string &fileName, uint startX, uint startY, uint width,
    uint height)
{
  CaptureBmpData bmp;
  auto res = CaptureScreen(bmp, startX, startY, width, height);
  if (res != StatusCode::CAPTURE_OK)
  {
    return res;
  }

  //保存文件
  res = SaveBmpBitsAsFile(fileName, bmp);
  return res;
}